

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkMemUtil.cpp
# Opt level: O0

MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> * __thiscall
vk::SimpleAllocator::allocate
          (MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *__return_storage_ptr__,
          SimpleAllocator *this,VkMemoryRequirements *memReqs,MemoryRequirement requirement)

{
  VkDeviceSize size;
  DeviceInterface *vkd;
  VkDevice device;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  data;
  bool bVar1;
  HostPtr *this_00;
  Handle<(vk::HandleType)7> *pHVar2;
  SimpleAllocation *this_01;
  undefined4 uVar3;
  undefined1 in_stack_fffffffffffffeac [12];
  DefaultDeleter<vk::Allocation> local_fa;
  undefined1 local_f9;
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_f8;
  Move<vk::Handle<(vk::HandleType)7>_> local_e8;
  DefaultDeleter<vk::(anonymous_namespace)::HostPtr> local_c1;
  deUint64 local_c0;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  local_b8;
  PtrData<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  *local_a8;
  deUint32 local_94;
  MemoryRequirement local_90 [4];
  undefined1 local_80 [8];
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  hostPtr;
  Move<vk::Handle<(vk::HandleType)7>_> mem;
  VkMemoryAllocateInfo allocInfo;
  deUint32 memoryTypeNdx;
  VkMemoryRequirements *memReqs_local;
  SimpleAllocator *this_local;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *pMStack_10;
  MemoryRequirement requirement_local;
  
  this_local._4_4_ = requirement.m_flags;
  pMStack_10 = __return_storage_ptr__;
  anon_unknown_5::selectMatchingMemoryType(&this->m_memProps,memReqs->memoryTypeBits,requirement);
  mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator._0_4_ = 5;
  size = memReqs->size;
  allocateMemory((Move<vk::Handle<(vk::HandleType)7>_> *)
                 &hostPtr.
                  super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                  .m_data.field_0x8,this->m_vk,this->m_device,
                 (VkMemoryAllocateInfo *)
                 &mem.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.deleter.m_allocator,
                 (VkAllocationCallbacks *)0x0);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             *)local_80);
  local_94 = MemoryRequirement::HostVisible.m_flags;
  local_90[0] = MemoryRequirement::operator&
                          ((MemoryRequirement *)((long)&this_local + 4),
                           MemoryRequirement::HostVisible);
  bVar1 = MemoryRequirement::operator_cast_to_bool(local_90);
  if (bVar1) {
    this_00 = (HostPtr *)operator_new(0x20);
    vkd = this->m_vk;
    device = this->m_device;
    pHVar2 = refdetails::RefBase<vk::Handle<(vk::HandleType)7>_>::operator*
                       ((RefBase<vk::Handle<(vk::HandleType)7>_> *)
                        &hostPtr.
                         super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                         .m_data.field_0x8);
    local_c0 = pHVar2->m_internal;
    uVar3 = 0;
    anon_unknown_5::HostPtr::HostPtr(this_00,vkd,device,(VkDeviceMemory)local_c0,0,size,0);
    de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>::DefaultDeleter(&local_c1);
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
               *)&local_b8);
    local_a8 = de::details::MovePtr::operator_cast_to_PtrData(&local_b8,(MovePtr *)this_00);
    data._4_12_ = in_stack_fffffffffffffeac;
    data.ptr._0_4_ = uVar3;
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::operator=((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                 *)local_80,data);
    de::details::
    MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
    ::~MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
                *)&local_b8);
  }
  this_01 = (SimpleAllocation *)operator_new(0x50);
  local_f9 = 1;
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::Move
            (&local_e8,
             (Move<vk::Handle<(vk::HandleType)7>_> *)
             &hostPtr.
              super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              .m_data.field_0x8);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::MovePtr(&local_f8,
            (MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
             *)local_80);
  SimpleAllocation::SimpleAllocation(this_01,&local_e8,&local_f8);
  local_f9 = 0;
  de::DefaultDeleter<vk::Allocation>::DefaultDeleter(&local_fa);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (__return_storage_ptr__,this_01);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~MovePtr(&local_f8);
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_e8);
  de::details::
  MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
  ::~MovePtr((MovePtr<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              *)local_80);
  refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)7>_> *)
             &hostPtr.
              super_UniqueBase<vk::(anonymous_namespace)::HostPtr,_de::DefaultDeleter<vk::(anonymous_namespace)::HostPtr>_>
              .m_data.field_0x8);
  return __return_storage_ptr__;
}

Assistant:

MovePtr<Allocation> SimpleAllocator::allocate (const VkMemoryRequirements& memReqs, MemoryRequirement requirement)
{
	const deUint32				memoryTypeNdx	= selectMatchingMemoryType(m_memProps, memReqs.memoryTypeBits, requirement);
	const VkMemoryAllocateInfo	allocInfo		=
	{
		VK_STRUCTURE_TYPE_MEMORY_ALLOCATE_INFO,	//	VkStructureType			sType;
		DE_NULL,								//	const void*				pNext;
		memReqs.size,							//	VkDeviceSize			allocationSize;
		memoryTypeNdx,							//	deUint32				memoryTypeIndex;
	};

	Move<VkDeviceMemory>		mem				= allocateMemory(m_vk, m_device, &allocInfo);
	MovePtr<HostPtr>			hostPtr;

	if (requirement & MemoryRequirement::HostVisible)
	{
		DE_ASSERT(isHostVisibleMemory(m_memProps, allocInfo.memoryTypeIndex));
		hostPtr = MovePtr<HostPtr>(new HostPtr(m_vk, m_device, *mem, 0u, allocInfo.allocationSize, 0u));
	}

	return MovePtr<Allocation>(new SimpleAllocation(mem, hostPtr));
}